

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlCatalogEntryPtr
xmlNewCatalogEntry(xmlCatalogEntryType type,xmlChar *name,xmlChar *value,xmlChar *URL,
                  xmlCatalogPrefer prefer,xmlCatalogEntryPtr group)

{
  xmlChar *pxVar1;
  xmlChar *local_58;
  xmlChar *local_50;
  xmlChar *normid;
  xmlCatalogEntryPtr ret;
  xmlCatalogEntryPtr group_local;
  xmlChar *pxStack_30;
  xmlCatalogPrefer prefer_local;
  xmlChar *URL_local;
  xmlChar *value_local;
  xmlChar *name_local;
  xmlCatalogEntryPtr pxStack_10;
  xmlCatalogEntryType type_local;
  
  local_50 = (xmlChar *)0x0;
  pxStack_10 = (xmlCatalogEntryPtr)(*xmlMalloc)(0x50);
  if (pxStack_10 == (xmlCatalogEntryPtr)0x0) {
    xmlCatalogErrMemory();
    pxStack_10 = (xmlCatalogEntryPtr)0x0;
  }
  else {
    pxStack_10->next = (_xmlCatalogEntry *)0x0;
    pxStack_10->parent = (_xmlCatalogEntry *)0x0;
    pxStack_10->children = (_xmlCatalogEntry *)0x0;
    pxStack_10->type = type;
    value_local = name;
    if (((type == XML_CATA_PUBLIC) || (type == XML_CATA_DELEGATE_PUBLIC)) &&
       (local_50 = xmlCatalogNormalizePublic(name), local_50 != (xmlChar *)0x0)) {
      local_58 = local_50;
      if (*local_50 == '\0') {
        local_58 = (xmlChar *)0x0;
      }
      value_local = local_58;
    }
    if (value_local == (xmlChar *)0x0) {
      pxStack_10->name = (xmlChar *)0x0;
    }
    else {
      pxVar1 = xmlStrdup(value_local);
      pxStack_10->name = pxVar1;
    }
    if (local_50 != (xmlChar *)0x0) {
      (*xmlFree)(local_50);
    }
    if (value == (xmlChar *)0x0) {
      pxStack_10->value = (xmlChar *)0x0;
    }
    else {
      pxVar1 = xmlStrdup(value);
      pxStack_10->value = pxVar1;
    }
    pxStack_30 = URL;
    if (URL == (xmlChar *)0x0) {
      pxStack_30 = value;
    }
    if (pxStack_30 == (xmlChar *)0x0) {
      pxStack_10->URL = (xmlChar *)0x0;
    }
    else {
      pxVar1 = xmlStrdup(pxStack_30);
      pxStack_10->URL = pxVar1;
    }
    pxStack_10->prefer = prefer;
    pxStack_10->dealloc = 0;
    pxStack_10->depth = 0;
    pxStack_10->group = group;
  }
  return pxStack_10;
}

Assistant:

static xmlCatalogEntryPtr
xmlNewCatalogEntry(xmlCatalogEntryType type, const xmlChar *name,
	   const xmlChar *value, const xmlChar *URL, xmlCatalogPrefer prefer,
	   xmlCatalogEntryPtr group) {
    xmlCatalogEntryPtr ret;
    xmlChar *normid = NULL;

    ret = (xmlCatalogEntryPtr) xmlMalloc(sizeof(xmlCatalogEntry));
    if (ret == NULL) {
        xmlCatalogErrMemory();
	return(NULL);
    }
    ret->next = NULL;
    ret->parent = NULL;
    ret->children = NULL;
    ret->type = type;
    if (type == XML_CATA_PUBLIC || type == XML_CATA_DELEGATE_PUBLIC) {
        normid = xmlCatalogNormalizePublic(name);
        if (normid != NULL)
            name = (*normid != 0 ? normid : NULL);
    }
    if (name != NULL)
	ret->name = xmlStrdup(name);
    else
	ret->name = NULL;
    if (normid != NULL)
        xmlFree(normid);
    if (value != NULL)
	ret->value = xmlStrdup(value);
    else
	ret->value = NULL;
    if (URL == NULL)
	URL = value;
    if (URL != NULL)
	ret->URL = xmlStrdup(URL);
    else
	ret->URL = NULL;
    ret->prefer = prefer;
    ret->dealloc = 0;
    ret->depth = 0;
    ret->group = group;
    return(ret);
}